

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdp_world.cpp
# Opt level: O0

bool __thiscall despot::POMDPWorld::ExecuteAction(POMDPWorld *this,ACT_TYPE action,OBS_TYPE *obs)

{
  DSPOMDP *pDVar1;
  State *pSVar2;
  int iVar3;
  ostream *poVar4;
  void *this_00;
  bool terminal;
  OBS_TYPE *obs_local;
  ACT_TYPE action_local;
  POMDPWorld *this_local;
  
  iVar3 = (*this->model_->_vptr_DSPOMDP[5])();
  obs_local._4_4_ = action;
  if (iVar3 <= action) {
    poVar4 = std::operator<<((ostream *)&std::cout,"WARNING: Planned action ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,action);
    poVar4 = std::operator<<(poVar4," set to maximum allowed value ");
    iVar3 = (*this->model_->_vptr_DSPOMDP[5])();
    this_00 = (void *)std::ostream::operator<<(poVar4,iVar3 + -1);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    iVar3 = (*this->model_->_vptr_DSPOMDP[5])();
    obs_local._4_4_ = iVar3 - 1;
  }
  pDVar1 = this->model_;
  pSVar2 = (this->super_World).state_;
  Random::NextDouble(&this->random_);
  iVar3 = (*pDVar1->_vptr_DSPOMDP[2])(pDVar1,pSVar2,(ulong)obs_local._4_4_,&this->step_reward_,obs);
  return (bool)((byte)iVar3 & 1);
}

Assistant:

bool POMDPWorld::ExecuteAction(ACT_TYPE action, OBS_TYPE& obs) {
	if (action >= model_->NumActions()) {
		cout << "WARNING: Planned action " << action << 
			" set to maximum allowed value " << (model_->NumActions() - 1) << endl;
		action = model_->NumActions() - 1;
	}
	bool terminal = model_->Step(*state_, random_.NextDouble(), action,
			step_reward_, obs);
	return terminal;
}